

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_usage.c
# Opt level: O2

HT_ErrorCode
ht_memory_usage_get_usage
          (HT_MemoryUsageContext *context,size_t *virtual_memory_bytes,size_t *shared_memory_bytes,
          size_t *resident_memory_bytes)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  long lVar3;
  HT_ErrorCode HVar4;
  unsigned_long_long shared_mem;
  unsigned_long_long resident_mem;
  unsigned_long_long virt_mem;
  char buf [64];
  
  if (context == (HT_MemoryUsageContext *)0x0) {
    HVar4 = HT_ERR_INVALID_ARGUMENT;
  }
  else {
    HVar4 = HT_ERR_OK;
    if ((virtual_memory_bytes != (size_t *)0x0 || shared_memory_bytes != (size_t *)0x0) ||
        resident_memory_bytes != (size_t *)0x0) {
      snprintf(buf,0x20,"/proc/%d/statm",(ulong)(uint)context->pid);
      __stream = fopen(buf,"r");
      if (__stream == (FILE *)0x0) {
        HVar4 = HT_ERR_CANT_OPEN_FILE;
      }
      else {
        sVar2 = fread(buf,1,0x3f,__stream);
        fclose(__stream);
        HVar4 = HT_ERR_INVALID_FORMAT;
        if (0xf < sVar2) {
          buf[sVar2] = '\0';
          iVar1 = __isoc99_sscanf(buf,"%llu %llu %llu",&virt_mem,&resident_mem,&shared_mem);
          if (iVar1 == 3) {
            lVar3 = sysconf(0x1e);
            if (virtual_memory_bytes != (size_t *)0x0) {
              *virtual_memory_bytes = virt_mem * lVar3;
            }
            if (resident_memory_bytes != (size_t *)0x0) {
              *resident_memory_bytes = resident_mem * lVar3;
            }
            HVar4 = HT_ERR_OK;
            if (shared_memory_bytes != (size_t *)0x0) {
              *shared_memory_bytes = lVar3 * shared_mem;
            }
          }
        }
      }
    }
  }
  return HVar4;
}

Assistant:

HT_ErrorCode
ht_memory_usage_get_usage(HT_MemoryUsageContext* context,
                          size_t* virtual_memory_bytes,
                          size_t* shared_memory_bytes,
                          size_t* resident_memory_bytes)
{
    char buf[64];
    unsigned long page_size;
    unsigned long long virt_mem;
    unsigned long long resident_mem;
    unsigned long long shared_mem;
    FILE* fp;

    if (!context)
    {
        return HT_ERR_INVALID_ARGUMENT;
    }

    if (!virtual_memory_bytes && !shared_memory_bytes && !resident_memory_bytes)
    {
        return HT_ERR_OK;
    }

    snprintf(buf, 32, "/proc/%d/statm", context->pid);

    if ((fp = fopen(buf, "r")) == NULL)
    {
        return HT_ERR_CANT_OPEN_FILE;
    }

    size_t num = fread(buf, 1, sizeof(buf) - 1, fp);
    fclose(fp);

    if (num < 16)
    {
        return HT_ERR_INVALID_FORMAT;
    }

    buf[num] = '\0';

    if (sscanf(buf, "%llu %llu %llu", &virt_mem, &resident_mem, &shared_mem) != 3)
    {
        return HT_ERR_INVALID_FORMAT;
    }

    page_size = (unsigned long)sysconf(_SC_PAGESIZE);

    if (virtual_memory_bytes)
    {
        *virtual_memory_bytes = virt_mem * page_size;
    }
    if (resident_memory_bytes)
    {
        *resident_memory_bytes = resident_mem * page_size;
    }
    if (shared_memory_bytes)
    {
        *shared_memory_bytes = shared_mem * page_size;
    }

    return HT_ERR_OK;
}